

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

void __thiscall CTcMake::maybe_add_include_path(CTcMake *this,textchar_t *path)

{
  CTcMakePath *pCVar1;
  int iVar2;
  textchar_t *__s1;
  CTcMakePath **ppCVar3;
  
  ppCVar3 = &this->inc_head_;
  do {
    pCVar1 = *ppCVar3;
    if (pCVar1 == (CTcMakePath *)0x0) {
      add_include_path(this,path);
      return;
    }
    __s1 = (pCVar1->path_).buf_;
    if (__s1 == (textchar_t *)0x0) {
      __s1 = "";
    }
    iVar2 = strcmp(__s1,path);
    ppCVar3 = &pCVar1->nxt_;
  } while (iVar2 != 0);
  return;
}

Assistant:

void CTcMake::maybe_add_include_path(const textchar_t *path)
{
    CTcMakePath *inc;

    /* 
     *   scan our existing list of include paths for a match to this path -
     *   if the path is already in our list, we don't want to bother adding
     *   it again 
     */
    for (inc = inc_head_ ; inc != 0 ; inc = inc->get_next())
    {
        /* 
         *   If this existing path matches the new path, we don't need to
         *   bother adding the new path.  Note that we just do a
         *   simple-minded string comparison of the paths, which might not
         *   always detect equivalent paths (this strategy can be fooled by
         *   hard/soft links, differing case in a case-insensitive file
         *   system, and relative vs. absolute notation, among other
         *   things); this isn't too important, though, because the worst
         *   that will happen is that we'll lose a little efficiency by
         *   searching the same directory twice.  
         */
        if (strcmp(inc->get_path(), path) == 0)
            return;
    }

    /* didn't find an exact match for the path, so add it */
    add_include_path(path);
}